

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BCPos bcemit_INS(FuncState *fs,BCIns ins)

{
  uint vtarget;
  LexState *pLVar1;
  long lVar2;
  BCInsLine *pBVar3;
  ptrdiff_t base;
  LexState *ls;
  BCPos pc;
  BCIns ins_local;
  FuncState *fs_local;
  
  vtarget = fs->pc;
  pLVar1 = fs->ls;
  jmp_patchval(fs,fs->jpc,vtarget,0xff,vtarget);
  fs->jpc = 0xffffffff;
  if (fs->bclim <= vtarget) {
    lVar2 = (long)fs->bcbase - (long)pLVar1->bcstack >> 3;
    if (0x3ffffff < pLVar1->sizebcstack) {
      err_limit(fs,0x4000000,"bytecode instructions");
    }
    pBVar3 = (BCInsLine *)lj_mem_grow(fs->L,pLVar1->bcstack,&pLVar1->sizebcstack,0x4000000,8);
    pLVar1->bcstack = pBVar3;
    fs->bclim = pLVar1->sizebcstack - (int)lVar2;
    fs->bcbase = pLVar1->bcstack + lVar2;
  }
  fs->bcbase[vtarget].ins = ins;
  fs->bcbase[vtarget].line = pLVar1->lastline;
  fs->pc = vtarget + 1;
  return vtarget;
}

Assistant:

static BCPos bcemit_INS(FuncState *fs, BCIns ins)
{
  BCPos pc = fs->pc;
  LexState *ls = fs->ls;
  jmp_patchval(fs, fs->jpc, pc, NO_REG, pc);
  fs->jpc = NO_JMP;
  if (LJ_UNLIKELY(pc >= fs->bclim)) {
    ptrdiff_t base = fs->bcbase - ls->bcstack;
    checklimit(fs, ls->sizebcstack, LJ_MAX_BCINS, "bytecode instructions");
    lj_mem_growvec(fs->L, ls->bcstack, ls->sizebcstack, LJ_MAX_BCINS,BCInsLine);
    fs->bclim = (BCPos)(ls->sizebcstack - base);
    fs->bcbase = ls->bcstack + base;
  }
  fs->bcbase[pc].ins = ins;
  fs->bcbase[pc].line = ls->lastline;
  fs->pc = pc+1;
  return pc;
}